

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void aom_upsampled_pred_c
               (MACROBLOCKD *xd,AV1_COMMON *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,int ref_stride,
               int subpel_search)

{
  ushort uVar1;
  InterpFilterParams *pIVar2;
  InterpFilterParams *pIVar3;
  scale_factors *psVar4;
  ptrdiff_t src_stride;
  int16_t *filter_y;
  short sVar5;
  uint uVar6;
  long *plVar7;
  bool bVar8;
  bool bVar9;
  uint8_t auStackY_90b8 [72];
  undefined8 uStackY_9070;
  uint8_t temp [36864];
  
  if (xd != (MACROBLOCKD *)0x0) {
    uVar1 = *(ushort *)&(*xd->mi)->field_0xa7 >> 7;
    uVar6 = uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      psVar4 = xd->block_ref_scale_factors[0];
    }
    else {
      psVar4 = &cm->sf_identity;
    }
    if ((psVar4->x_scale_fp == -1) || (psVar4->y_scale_fp == -1)) {
      bVar8 = false;
    }
    else {
      bVar8 = psVar4->y_scale_fp != 0x4000 || psVar4->x_scale_fp != 0x4000;
    }
    if (bVar8) {
      sVar5 = (short)uVar6;
      bVar9 = sVar5 == 0;
      temp._176_4_ = xd->bd;
      temp._68_4_ = 3;
      if (10 < (int)temp._176_4_) {
        temp._68_4_ = temp._176_4_ + -7;
      }
      temp._72_4_ = 0xb;
      if (10 < (int)temp._176_4_) {
        temp._72_4_ = 0x15 - temp._176_4_;
      }
      temp[0x30] = '\0';
      temp[0x31] = '\0';
      temp[0x32] = '\0';
      temp[0x33] = '\0';
      temp[0x38] = '\0';
      temp[0x39] = '\0';
      temp[0x3a] = '\0';
      temp[0x3b] = '\0';
      temp[0x3c] = '\0';
      temp[0x3d] = '\0';
      temp[0x3e] = '\0';
      temp[0x3f] = '\0';
      temp[0x40] = '\0';
      temp[0x41] = '\0';
      temp[0x42] = '\0';
      temp[0x43] = '\0';
      temp[0x4c] = '\0';
      temp[0x4d] = '\0';
      temp[0x4e] = '\0';
      temp[0x4f] = '\0';
      temp[0x50] = '\0';
      temp[0x51] = '\0';
      temp[0x52] = '\0';
      temp[0x53] = '\0';
      temp[0x54] = '\0';
      temp[0x55] = '\0';
      temp[0x56] = '\0';
      temp[0x57] = '\0';
      temp._160_4_ = xd->plane[0].subsampling_x;
      temp._164_4_ = xd->plane[0].subsampling_y;
      temp._120_4_ = (mi_row << 2) >> ((byte)temp._164_4_ & 0x1f);
      temp._124_4_ = (mi_col << 2) >> ((byte)temp._160_4_ & 0x1f);
      temp._208_4_ = (0x120U >> ((byte)temp._164_4_ & 0x1f)) * -0x400 + 0x1000;
      temp._212_4_ = (0x120U >> ((byte)temp._160_4_ & 0x1f)) * -0x400 + 0x1000;
      temp._112_4_ = width;
      temp._116_4_ = height;
      temp._180_4_ = (uint)xd->cur_buf->flags >> 3 & 1;
      temp[0] = '\0';
      temp[1] = '\0';
      temp[2] = '\0';
      temp[3] = '\0';
      temp[4] = '\0';
      temp[5] = '\0';
      temp[6] = '\0';
      temp[7] = '\0';
      if (sVar5 == 0) {
        pIVar2 = av1_interp_filter_params_list;
        pIVar3 = av1_interp_filter_params_list;
        if (width < 5) {
          pIVar3 = av1_interp_4tap;
        }
        temp._96_8_ = pIVar3;
        if (height < 5) {
          pIVar2 = av1_interp_4tap;
        }
      }
      else {
        pIVar2 = &av1_intrabc_filter_params;
        temp._96_8_ = &av1_intrabc_filter_params;
      }
      temp._128_8_ = xd->plane[0].pre[(ulong)bVar9 - 1].buf;
      temp._136_8_ = xd->plane[0].pre[(ulong)bVar9 - 1].buf0;
      temp._144_8_ = *(undefined8 *)&xd->plane[0].pre[(ulong)bVar9 - 1].width;
      temp._152_8_ = *(undefined8 *)&xd->plane[0].pre[(ulong)bVar9 - 1].stride;
      temp._104_8_ = pIVar2;
      temp._168_8_ = psVar4;
      temp._204_4_ = uVar6;
      build_one_inter_predictor(comp_pred,width,mv,(InterPredParams *)temp);
      if (bVar8) {
        return;
      }
    }
  }
  if (subpel_search - 1U < 3) {
    plVar7 = *(long **)(&DAT_005d6d90 + (ulong)(subpel_search - 1U) * 8);
  }
  else {
    plVar7 = (long *)0x0;
  }
  if (subpel_y_q3 == 0 && subpel_x_q3 == 0) {
    if (0 < height) {
      do {
        memcpy(comp_pred,ref,(long)width);
        comp_pred = comp_pred + width;
        ref = ref + ref_stride;
        height = height + -1;
      } while (height != 0);
    }
  }
  else if (subpel_y_q3 == 0) {
    uStackY_9070 = 0x22c13e;
    aom_convolve8_horiz_c
              (ref,(long)ref_stride,comp_pred,(long)width,
               (int16_t *)((long)(subpel_x_q3 * 2) * (ulong)*(ushort *)(plVar7 + 1) * 2 + *plVar7),
               0x10,(int16_t *)0x0,-1,width,height);
  }
  else {
    if (subpel_x_q3 == 0) {
      filter_y = (int16_t *)((long)(subpel_y_q3 * 2) * (ulong)*(ushort *)(plVar7 + 1) * 2 + *plVar7)
      ;
      src_stride = (ptrdiff_t)ref_stride;
    }
    else {
      uVar1 = *(ushort *)(plVar7 + 1);
      filter_y = (int16_t *)(*plVar7 + (long)(subpel_y_q3 * 2) * (ulong)uVar1 * 2);
      uStackY_9070 = 0x22c0aa;
      aom_convolve8_horiz_c
                (ref + -(long)(int)(((uVar1 >> 1) - 1) * ref_stride),(long)ref_stride,temp,0x80,
                 (int16_t *)(*plVar7 + (long)(subpel_x_q3 * 2) * (ulong)uVar1 * 2),0x10,
                 (int16_t *)0x0,-1,width,(subpel_y_q3 + height * 8 + -8 >> 3) + (uint)uVar1);
      ref = auStackY_90b8 + ((*(ushort *)(plVar7 + 1) & 0x3fffffe) << 6);
      src_stride = 0x80;
    }
    uStackY_9070 = 0x22c176;
    aom_convolve8_vert_c
              (ref,src_stride,comp_pred,(long)width,(int16_t *)0x0,-1,filter_y,0x10,width,height);
  }
  return;
}

Assistant:

void aom_upsampled_pred_c(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                          int mi_row, int mi_col, const MV *const mv,
                          uint8_t *comp_pred, int width, int height,
                          int subpel_x_q3, int subpel_y_q3, const uint8_t *ref,
                          int ref_stride, int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);

  if (!subpel_x_q3 && !subpel_y_q3) {
    for (int i = 0; i < height; i++) {
      memcpy(comp_pred, ref, width * sizeof(*comp_pred));
      comp_pred += width;
      ref += ref_stride;
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_convolve8_horiz_c(ref, ref_stride, comp_pred, width, kernel, 16, NULL,
                          -1, width, height);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_convolve8_vert_c(ref, ref_stride, comp_pred, width, NULL, -1, kernel,
                         16, width, height);
  } else {
    DECLARE_ALIGNED(16, uint8_t,
                    temp[((MAX_SB_SIZE * 2 + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter->taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_convolve8_horiz_c(ref - ref_stride * ((filter->taps >> 1) - 1),
                          ref_stride, temp, MAX_SB_SIZE, kernel_x, 16, NULL, -1,
                          width, intermediate_height);
    aom_convolve8_vert_c(temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1),
                         MAX_SB_SIZE, comp_pred, width, NULL, -1, kernel_y, 16,
                         width, height);
  }
}